

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

void build_colors(chunk *c,int *colors,int *counts,_Bool *stairs,_Bool diagonal)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  loc_conflict lVar4;
  queue *q;
  void *__s;
  uintptr_t uVar5;
  wchar_t wVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  loc local_70;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t local_60;
  int local_5c;
  int *local_58;
  _Bool *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_68 = c->height;
  if (L'\0' < local_68) {
    wVar6 = c->width;
    local_38 = (ulong)diagonal * 4 + 4;
    iVar7 = 1;
    uVar10 = 0;
    local_64 = wVar6;
    local_58 = counts;
    local_50 = stairs;
    do {
      if (L'\0' < wVar6) {
        wVar3 = L'\0';
        local_40 = uVar10;
        do {
          lVar4 = loc(wVar3,(int)uVar10);
          wVar2 = ignore_point(c,colors,lVar4);
          if (wVar2 == L'\0') {
            local_60 = wVar3;
            lVar4 = loc(wVar3,(int)uVar10);
            wVar6 = c->width;
            sVar9 = (long)c->height * (long)wVar6;
            q = q_new(sVar9);
            __s = mem_zalloc(sVar9 * 4);
            if (0 < (int)sVar9) {
              memset(__s,0,(sVar9 & 0xffffffff) << 2);
            }
            wVar3 = grid_to_i(lVar4,wVar6);
            q_push(q,(long)wVar3);
            local_48 = (long)iVar7;
            local_58[local_48] = 0;
            local_5c = iVar7;
            while (sVar9 = q_len(q), sVar9 != 0) {
              uVar5 = q_pop(q);
              i_to_grid((wchar_t)uVar5,wVar6,(loc_conflict *)&local_70);
              wVar3 = ignore_point(c,colors,(loc_conflict)local_70);
              if (wVar3 == L'\0') {
                colors[(wchar_t)uVar5] = (int)local_48;
                local_58[local_48] = local_58[local_48] + 1;
                if ((local_50 != (_Bool *)0x0) &&
                   (_Var1 = square_isstairs((chunk_conflict *)c,local_70), _Var1)) {
                  local_50[local_48] = true;
                }
                lVar8 = 0;
                do {
                  lVar4 = loc_sum((loc_conflict)local_70,(loc_conflict)ddgrid_ddd[lVar8]);
                  wVar3 = grid_to_i(lVar4,wVar6);
                  wVar2 = ignore_point(c,colors,lVar4);
                  if ((wVar2 == L'\0') &&
                     (uVar5 = (uintptr_t)wVar3, *(int *)((long)__s + uVar5 * 4) == 0)) {
                    q_push(q,uVar5);
                    *(undefined4 *)((long)__s + uVar5 * 4) = 1;
                  }
                  lVar8 = lVar8 + 1;
                } while (local_38 != lVar8);
              }
            }
            mem_free(__s);
            q_free(q);
            iVar7 = local_5c + 1;
            uVar10 = local_40;
            wVar6 = local_64;
            wVar3 = local_60;
          }
          wVar3 = wVar3 + L'\x01';
        } while (wVar3 != wVar6);
      }
      wVar3 = (int)uVar10 + L'\x01';
      uVar10 = (ulong)(uint)wVar3;
    } while (wVar3 != local_68);
  }
  return;
}

Assistant:

static void build_colors(struct chunk *c, int colors[], int counts[],
		bool *stairs, bool diagonal)
{
	int y, x;
	int h = c->height;
	int w = c->width;
	int color = 1;

	for (y = 0; y < h; y++) {
		for (x = 0; x < w; x++) {
			if (ignore_point(c, colors, loc(x, y))) continue;
			build_color_point(c, colors, counts, stairs,
				loc(x, y), color, diagonal);
			color++;
		}
	}
}